

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O3

void rng_spawn(RNG_state *mystate,RNG_state *newstate,int spawnnumber)

{
  uint_8t bytes [4];
  uint local_7c;
  sha1_ctx local_78;
  
  local_7c = (uint)spawnnumber >> 0x18 | (spawnnumber & 0xff0000U) >> 8 |
             (spawnnumber & 0xff00U) << 8 | spawnnumber << 0x18;
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  local_78.hash[0] = 0x67452301;
  local_78.hash[1] = 0xefcdab89;
  local_78.hash[2] = 0x98badcfe;
  local_78.hash[3] = 0x10325476;
  local_78.hash[4] = 0xc3d2e1f0;
  sha1_hash(mystate,0x14,&local_78);
  sha1_hash((uchar *)&local_7c,4,&local_78);
  sha1_end(newstate,&local_78);
  return;
}

Assistant:

void rng_spawn(RNG_state *mystate, RNG_state *newstate, int spawnnumber)
{
	struct sha1_context ctx;
	uint_8t  bytes[4];
	
	bytes[0] = 0xFF & (spawnnumber >> 24);
	bytes[1] = 0xFF & (spawnnumber >> 16);
	bytes[2] = 0xFF & (spawnnumber >> 8);
	bytes[3] = 0xFF & spawnnumber;
	
	sha1_begin(&ctx);
	sha1_hash(mystate, 20, &ctx);
	sha1_hash(bytes, 4, &ctx);
	sha1_end(newstate, &ctx);
}